

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

int Fra_ClassesCountLits(Fra_Cla_t *p)

{
  int iVar1;
  Aig_Obj_t **pClass;
  int i;
  int iVar2;
  
  iVar2 = p->vClasses1->nSize;
  i = 0;
  while( true ) {
    if (p->vClasses->nSize <= i) {
      return iVar2;
    }
    pClass = (Aig_Obj_t **)Vec_PtrEntry(p->vClasses,i);
    iVar1 = Fra_ClassCount(pClass);
    if (iVar1 < 2) break;
    iVar2 = iVar2 + iVar1 + -1;
    i = i + 1;
  }
  __assert_fail("nNodes > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                ,0xac,"int Fra_ClassesCountLits(Fra_Cla_t *)");
}

Assistant:

int Fra_ClassesCountLits( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass;
    int i, nNodes, nLits = 0;
    nLits = Vec_PtrSize( p->vClasses1 );
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        nNodes = Fra_ClassCount( pClass );
        assert( nNodes > 1 );
        nLits += nNodes - 1;
    }
    return nLits;
}